

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O1

void __thiscall libtorrent::aux::session_settings::~session_settings(session_settings *this)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    plVar1 = (long *)((long)(this->m_store).m_ints._M_elems + lVar3 + -0x10);
    plVar2 = *(long **)((long)(this->m_store).m_ints._M_elems + lVar3 + -0x20);
    if (plVar1 != plVar2) {
      operator_delete(plVar2,*plVar1 + 1);
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x1a0);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT session_settings final : settings_interface
	{
		void set_str(int name, std::string value) override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			m_store.set_str(name, std::move(value));
		}
		void set_int(int name, int value) override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			m_store.set_int(name, value);
		}
		void set_bool(int name, bool value) override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			m_store.set_bool(name, value);
		}

		std::string const& get_str(int name) const override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			return m_store.get_str(name);
		}
		int get_int(int name) const override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			return m_store.get_int(name);
		}
		bool get_bool(int name) const override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			return m_store.get_bool(name);
		}

		bool has_val(int) const override { return true; }

		session_settings();
		explicit session_settings(settings_pack const&);

		void bulk_set(std::function<void(session_settings_single_thread&)>);
		void bulk_get(std::function<void(session_settings_single_thread const&)>) const;

		// since std::mutex is not copyable, we have to explicitly just copy the
		// underlying storage object. Lock the object we're copying from first,
		// and forward to a private copy constructor to keep the lock alive
		// inspired by https://www.justsoftwaresolutions.co.uk/threading/thread-safe-copy-constructors.html
		session_settings(session_settings const& lhs)
			: session_settings(lhs, std::unique_lock<std::mutex>(lhs.m_mutex))
		{}
		session_settings(session_settings&& lhs)
			: session_settings(std::move(lhs), std::unique_lock<std::mutex>(lhs.m_mutex))
		{}

		session_settings& operator=(session_settings const& rhs)
		{
			if (this == &rhs) return *this;
			// in C++17, use a single std::scoped_lock instead
			std::lock(rhs.m_mutex, m_mutex);
			std::unique_lock<std::mutex> l1(rhs.m_mutex, std::adopt_lock);
			std::unique_lock<std::mutex> l2(m_mutex, std::adopt_lock);
			m_store = rhs.m_store;
			return *this;
		}
		session_settings& operator=(session_settings&& rhs)
		{
			if (this == &rhs) return *this;
			m_store = std::move(rhs.m_store);
			return *this;
		}

	private:

		session_settings(session_settings const& lhs, std::unique_lock<std::mutex> const&)
			: settings_interface(lhs)
			, m_store(lhs.m_store)
		{}

		session_settings(session_settings&& lhs, std::unique_lock<std::mutex> const&)
			: settings_interface(lhs)
			, m_store(std::move(lhs.m_store))
		{}

		session_settings_single_thread m_store;
		mutable std::mutex m_mutex;
	};

}

namespace libtorrent {
	TORRENT_EXTRA_EXPORT void initialize_default_settings(aux::session_settings_single_thread& s);
}